

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O3

uint8_t * __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getBCD
          (SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this,int8_t *sign,
          int32_t *exponent,ValueLength *mantissaLength)

{
  byte *pbVar1;
  uint uVar2;
  byte *pbVar3;
  long lVar4;
  uint8_t *extraout_RAX;
  ulong uVar5;
  ValueLength VVar6;
  byte bVar7;
  ulong uVar8;
  char cVar9;
  byte bVar10;
  byte *pbVar11;
  bool bVar12;
  
  bVar10 = **(byte **)this;
  if (0xf < (ulong)bVar10 - 200) {
    SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice>::getBCD();
    return extraout_RAX;
  }
  bVar12 = (bVar10 & 0xf8) == 200;
  lVar4 = ((ulong)bVar12 << 3 | 0xffffffffffffff31) + (ulong)bVar10;
  *sign = -!bVar12 | 1;
  pbVar3 = *(byte **)this;
  bVar10 = *pbVar3;
  if ((bVar10 & 0xfe) == 0xee) {
    bVar7 = 0;
    pbVar11 = pbVar3;
    do {
      pbVar1 = pbVar11 + 9;
      pbVar11 = pbVar11 + 2;
      cVar9 = '\x02';
      if (bVar10 != 0xee) {
        pbVar11 = pbVar1;
        cVar9 = '\t';
      }
      bVar7 = bVar7 + cVar9;
      bVar10 = *pbVar11;
    } while ((bVar10 & 0xfe) == 0xee);
    uVar5 = (ulong)bVar7;
  }
  else {
    uVar5 = 0;
  }
  *exponent = *(int32_t *)(pbVar3 + lVar4 + 1 + uVar5);
  bVar10 = *pbVar3;
  if ((bVar10 & 0xfe) == 0xee) {
    bVar7 = 0;
    pbVar11 = pbVar3;
    do {
      pbVar1 = pbVar11 + 9;
      pbVar11 = pbVar11 + 2;
      cVar9 = '\x02';
      if (bVar10 != 0xee) {
        pbVar11 = pbVar1;
        cVar9 = '\t';
      }
      bVar7 = bVar7 + cVar9;
      bVar10 = *pbVar11;
    } while ((bVar10 & 0xfe) == 0xee);
    uVar5 = (ulong)bVar7;
  }
  else {
    uVar5 = 0;
  }
  switch(lVar4) {
  case 1:
    VVar6 = (ValueLength)pbVar3[uVar5 + 1];
    break;
  case 2:
    VVar6 = (ValueLength)*(ushort *)(pbVar3 + uVar5 + 1);
    break;
  case 3:
    uVar8 = (ulong)pbVar3[uVar5 + 1];
    uVar5 = (ulong)*(ushort *)(pbVar3 + uVar5 + 2) << 8;
    goto LAB_0010dd85;
  case 4:
    VVar6 = (ValueLength)*(uint *)(pbVar3 + uVar5 + 1);
    break;
  case 5:
    uVar2 = *(uint *)(pbVar3 + uVar5 + 1);
    uVar5 = (ulong)pbVar3[uVar5 + 5];
    goto LAB_0010dd81;
  case 6:
    uVar2 = *(uint *)(pbVar3 + uVar5 + 1);
    uVar5 = (ulong)*(ushort *)(pbVar3 + uVar5 + 5);
LAB_0010dd81:
    uVar8 = (ulong)uVar2;
    uVar5 = uVar5 << 0x20;
LAB_0010dd85:
    VVar6 = uVar5 | uVar8;
    break;
  case 7:
    VVar6 = (ValueLength)
            CONCAT34(CONCAT12(pbVar3[uVar5 + 7],*(undefined2 *)(pbVar3 + uVar5 + 5)),
                     *(undefined4 *)(pbVar3 + uVar5 + 1));
    break;
  case 8:
    VVar6 = *(ValueLength *)(pbVar3 + uVar5 + 1);
    break;
  default:
    VVar6 = 0;
  }
  *mantissaLength = VVar6;
  bVar10 = *pbVar3;
  if ((bVar10 & 0xfe) == 0xee) {
    bVar7 = 0;
    pbVar11 = pbVar3;
    do {
      pbVar1 = pbVar11 + 9;
      pbVar11 = pbVar11 + 2;
      cVar9 = '\x02';
      if (bVar10 != 0xee) {
        pbVar11 = pbVar1;
        cVar9 = '\t';
      }
      bVar7 = bVar7 + cVar9;
      bVar10 = *pbVar11;
    } while ((bVar10 & 0xfe) == 0xee);
    uVar5 = (ulong)bVar7;
  }
  else {
    uVar5 = 0;
  }
  return pbVar3 + lVar4 + uVar5 + 5;
}

Assistant:

uint8_t const* getBCD(int8_t& sign, int32_t& exponent,
                        ValueLength& mantissaLength) const {
    if (VELOCYPACK_UNLIKELY(!isBCD())) {
      throw Exception(Exception::InvalidValueType, "Expecting type BCD");
    }

    uint64_t type = head();
    bool positive = type >= 0xc8 && type <= 0xcf;
    uint64_t mlenlen = type - (positive ? 0xc7 : 0xcf);

    sign = positive ? 1 : -1;
    exponent = static_cast<int32_t>(
        readIntegerFixed<uint32_t, 4>(valueStart() + 1 + mlenlen));
    mantissaLength =
        readIntegerNonEmpty<ValueLength>(valueStart() + 1, mlenlen);

    return valueStart() + 1 + mlenlen + 4;
  }